

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

string * getBtnsState_abi_cxx11_(void)

{
  int i;
  int iVar1;
  ulong uVar2;
  
  if (getBtnsState[abi:cxx11]()::sState_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&getBtnsState[abi:cxx11]()::sState_abi_cxx11_);
    if (iVar1 != 0) {
      getBtnsState[abi:cxx11]()::sState_abi_cxx11_._M_dataplus._M_p =
           (pointer)&getBtnsState[abi:cxx11]()::sState_abi_cxx11_.field_2;
      getBtnsState[abi:cxx11]()::sState_abi_cxx11_._M_string_length = 0;
      getBtnsState[abi:cxx11]()::sState_abi_cxx11_.field_2._M_local_buf[0] = '\0';
      __cxa_atexit(std::__cxx11::string::~string,&getBtnsState[abi:cxx11]()::sState_abi_cxx11_,
                   &__dso_handle);
      __cxa_guard_release(&getBtnsState[abi:cxx11]()::sState_abi_cxx11_);
    }
  }
  __getPinsState((GPIOClass *)btnPool,2,&getBtnsState[abi:cxx11]()::sState_abi_cxx11_);
  for (uVar2 = 0; uVar2 < getBtnsState[abi:cxx11]()::sState_abi_cxx11_._M_string_length;
      uVar2 = uVar2 + 1) {
    getBtnsState[abi:cxx11]()::sState_abi_cxx11_._M_dataplus._M_p[uVar2] =
         getBtnsState[abi:cxx11]()::sState_abi_cxx11_._M_dataplus._M_p[uVar2] == '0' | 0x30;
  }
  return &getBtnsState[abi:cxx11]()::sState_abi_cxx11_;
}

Assistant:

const string& getBtnsState()
{
    static string sState;
    __getPinsState(btnPool, BTNS_CNT, sState);
	for(int i = 0;i < sState.length(); i++)
	{
		sState[i] = (sState[i] == '0') ? '1' : '0';
	}
    return sState;
}